

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O3

bool AreCompatiblePointerTypes(PType *dest,PType *source,bool forcompare)

{
  _func_int **pp_Var1;
  PClass *pPVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PClass *pPVar5;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  bool bVar8;
  
  pPVar2 = PPointer::RegistrationInfo.MyClass;
  pPVar5 = (dest->super_PTypeBase).super_DObject.Class;
  if (pPVar5 == (PClass *)0x0) {
    iVar4 = (**(dest->super_PTypeBase).super_DObject._vptr_DObject)(dest);
    pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
    (dest->super_PTypeBase).super_DObject.Class = pPVar5;
  }
  pPVar3 = PPointer::RegistrationInfo.MyClass;
  bVar8 = pPVar5 != (PClass *)0x0;
  if (pPVar5 != pPVar2 && bVar8) {
    do {
      pPVar5 = pPVar5->ParentClass;
      bVar8 = pPVar5 != (PClass *)0x0;
      if (pPVar5 == pPVar2) break;
    } while (pPVar5 != (PClass *)0x0);
  }
  if (bVar8) {
    pPVar5 = (source->super_PTypeBase).super_DObject.Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(source->super_PTypeBase).super_DObject._vptr_DObject)(source);
      pPVar5 = (PClass *)CONCAT44(extraout_var_00,iVar4);
      (source->super_PTypeBase).super_DObject.Class = pPVar5;
    }
    pPVar2 = PClass::RegistrationInfo.MyClass;
    bVar8 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar3 && bVar8) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar8 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if ((bVar8) &&
       ((forcompare ||
        (*(char *)&dest[1].super_PTypeBase.super_DObject.Class ==
         *(char *)&source[1].super_PTypeBase.super_DObject.Class)))) {
      if (source == dest) {
        return true;
      }
      pp_Var1 = source[1].super_PTypeBase.super_DObject._vptr_DObject;
      pPVar5 = (PClass *)pp_Var1[1];
      if (pPVar5 == (PClass *)0x0) {
        pPVar5 = (PClass *)(**(code **)*pp_Var1)(pp_Var1);
        pp_Var1[1] = (_func_int *)pPVar5;
      }
      pPVar3 = PClass::RegistrationInfo.MyClass;
      bVar8 = pPVar5 != (PClass *)0x0;
      if (pPVar5 != pPVar2 && bVar8) {
        do {
          pPVar5 = pPVar5->ParentClass;
          bVar8 = pPVar5 != (PClass *)0x0;
          if (pPVar5 == pPVar2) break;
        } while (pPVar5 != (PClass *)0x0);
      }
      if (bVar8) {
        pp_Var1 = dest[1].super_PTypeBase.super_DObject._vptr_DObject;
        pPVar5 = (PClass *)pp_Var1[1];
        if (pPVar5 == (PClass *)0x0) {
          pPVar5 = (PClass *)(**(code **)*pp_Var1)(pp_Var1);
          pp_Var1[1] = (_func_int *)pPVar5;
        }
        bVar8 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar8) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar8 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (bVar8) {
          pp_Var6 = source[1].super_PTypeBase.super_DObject._vptr_DObject;
          pp_Var1 = dest[1].super_PTypeBase.super_DObject._vptr_DObject;
          if (forcompare) {
            pp_Var7 = pp_Var1;
            if (pp_Var1 == pp_Var6) {
              return true;
            }
            do {
              pp_Var7 = (_func_int **)pp_Var7[0x1a];
              if (pp_Var7 == pp_Var6) break;
            } while (pp_Var7 != (_func_int **)0x0);
            if (pp_Var7 != (_func_int **)0x0) {
              return true;
            }
          }
          else if (pp_Var6 == pp_Var1) {
            return true;
          }
          do {
            pp_Var6 = (_func_int **)pp_Var6[0x1a];
            if (pp_Var6 == pp_Var1) {
              return pp_Var6 != (_func_int **)0x0;
            }
          } while (pp_Var6 != (_func_int **)0x0);
          return pp_Var6 != (_func_int **)0x0;
        }
      }
    }
  }
  return false;
}

Assistant:

static bool AreCompatiblePointerTypes(PType *dest, PType *source, bool forcompare = false)
{
	if (dest->IsKindOf(RUNTIME_CLASS(PPointer)) && source->IsKindOf(RUNTIME_CLASS(PPointer)))
	{
		// Pointers to different types are only compatible if both point to an object and the source type is a child of the destination type.
		auto fromtype = static_cast<PPointer *>(source);
		auto totype = static_cast<PPointer *>(dest);
		if (fromtype == nullptr) return true;
		if (!forcompare && totype->IsConst != fromtype->IsConst) return false;
		if (fromtype == totype) return true;
		if (fromtype->PointedType->IsKindOf(RUNTIME_CLASS(PClass)) && totype->PointedType->IsKindOf(RUNTIME_CLASS(PClass)))
		{
			auto fromcls = static_cast<PClass *>(fromtype->PointedType);
			auto tocls = static_cast<PClass *>(totype->PointedType);
			if (forcompare && tocls->IsDescendantOf(fromcls)) return true;
			return (fromcls->IsDescendantOf(tocls));
		}
	}
	return false;
}